

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_flattened_io_block_struct
          (CompilerGLSL *this,string *basename,SPIRType *type,char *qual,
          SmallVector<unsigned_int,_8UL> *indices)

{
  uint *puVar1;
  size_t sVar2;
  string *basename_00;
  char *qual_00;
  SPIRType *pSVar3;
  SPIRType *pSVar4;
  CompilerError *this_00;
  uint32_t i;
  ulong uVar5;
  long lVar6;
  allocator local_99;
  string *local_98;
  char *local_90;
  string local_88;
  SmallVector<unsigned_int,_8UL> sub_indices;
  
  local_98 = basename;
  local_90 = qual;
  SmallVector<unsigned_int,_8UL>::SmallVector(&sub_indices,indices);
  local_88._M_dataplus._M_p._0_4_ = 0;
  SmallVector<unsigned_int,_8UL>::push_back(&sub_indices,(uint *)&local_88);
  puVar1 = (indices->super_VectorView<unsigned_int>).ptr;
  sVar2 = (indices->super_VectorView<unsigned_int>).buffer_size;
  pSVar3 = type;
  for (lVar6 = 0; qual_00 = local_90, basename_00 = local_98, sVar2 << 2 != lVar6; lVar6 = lVar6 + 4
      ) {
    pSVar3 = Compiler::get<spirv_cross::SPIRType>
                       (&this->super_Compiler,
                        (pSVar3->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                        [*(uint *)((long)puVar1 + lVar6)].id);
  }
  if (*(int *)&(pSVar3->super_IVariant).field_0xc == 0xf) {
    if ((pSVar3->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      for (uVar5 = 0;
          uVar5 < (uint)(pSVar3->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
          uVar5 = uVar5 + 1) {
        sub_indices.super_VectorView<unsigned_int>.ptr
        [sub_indices.super_VectorView<unsigned_int>.buffer_size - 1] = (uint)uVar5;
        pSVar4 = Compiler::get<spirv_cross::SPIRType>
                           (&this->super_Compiler,
                            (pSVar3->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                            [uVar5].id);
        if (*(int *)&(pSVar4->super_IVariant).field_0xc == 0xf) {
          emit_flattened_io_block_struct(this,basename_00,type,qual_00,&sub_indices);
        }
        else {
          emit_flattened_io_block_member(this,basename_00,type,qual_00,&sub_indices);
        }
      }
      SmallVector<unsigned_int,_8UL>::~SmallVector(&sub_indices);
      return;
    }
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_88,"Cannot flatten array of structs in I/O blocks.",&local_99);
    CompilerError::CompilerError(this_00,&local_88);
    __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  __assert_fail("member_type->basetype == SPIRType::Struct",
                "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp"
                ,0xa25,
                "void spirv_cross::CompilerGLSL::emit_flattened_io_block_struct(const std::string &, const SPIRType &, const char *, const SmallVector<uint32_t> &)"
               );
}

Assistant:

void CompilerGLSL::emit_flattened_io_block_struct(const std::string &basename, const SPIRType &type, const char *qual,
                                                  const SmallVector<uint32_t> &indices)
{
	auto sub_indices = indices;
	sub_indices.push_back(0);

	const SPIRType *member_type = &type;
	for (auto &index : indices)
		member_type = &get<SPIRType>(member_type->member_types[index]);

	assert(member_type->basetype == SPIRType::Struct);

	if (!member_type->array.empty())
		SPIRV_CROSS_THROW("Cannot flatten array of structs in I/O blocks.");

	for (uint32_t i = 0; i < uint32_t(member_type->member_types.size()); i++)
	{
		sub_indices.back() = i;
		if (get<SPIRType>(member_type->member_types[i]).basetype == SPIRType::Struct)
			emit_flattened_io_block_struct(basename, type, qual, sub_indices);
		else
			emit_flattened_io_block_member(basename, type, qual, sub_indices);
	}
}